

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere_drawing.cpp
# Opt level: O2

void CGL::Misc::draw_sphere_opengl(Vector3D *p,double r,Color *c)

{
  char cVar1;
  undefined8 local_18;
  float local_10;
  
  local_18._0_4_ = c->r;
  local_18._4_4_ = c->g;
  local_10 = c->b;
  cVar1 = glIsEnabled(0xb50);
  if (cVar1 == '\0') {
    glColor3fv(&local_18);
    draw_sphere(p,r);
  }
  else {
    glDisable(0xb50);
    glColor3fv(&local_18);
    draw_sphere(p,r);
    glEnable(0xb50);
  }
  return;
}

Assistant:

void draw_sphere_opengl(const Vector3D& p, double r, const Color& c) {
  GLfloat temp[3];
  temp[0] = c.r;
  temp[1] = c.g;
  temp[2] = c.b;

  if (glIsEnabled(GL_LIGHTING)) {
    glDisable(GL_LIGHTING);
    glColor3fv(temp);
    draw_sphere(p, r);
    glEnable(GL_LIGHTING);
  } else {
    glColor3fv(temp);
    draw_sphere(p, r);
  }
}